

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

void get_cdef_filter_strengths
               (CDEF_PICK_METHOD pick_method,int *pri_strength,int *sec_strength,int strength_idx)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = 1;
  if (pick_method != CDEF_FAST_SEARCH_LVL5) {
    iVar3 = (pick_method < CDEF_FAST_SEARCH_LVL3) + 2 + (uint)(pick_method < CDEF_FAST_SEARCH_LVL3);
  }
  iVar1 = strength_idx / iVar3;
  *pri_strength = iVar1;
  *sec_strength = strength_idx % iVar3;
  switch(pick_method) {
  case CDEF_FAST_SEARCH_LVL1:
    piVar2 = priconv_lvl1;
    break;
  case CDEF_FAST_SEARCH_LVL2:
    piVar2 = priconv_lvl2;
    break;
  case CDEF_FAST_SEARCH_LVL3:
    piVar2 = priconv_lvl2;
    goto LAB_001da984;
  case CDEF_FAST_SEARCH_LVL4:
    piVar2 = priconv_lvl4;
LAB_001da984:
    *pri_strength = piVar2[iVar1];
    *sec_strength = secconv_lvl3[strength_idx % iVar3];
    return;
  case CDEF_FAST_SEARCH_LVL5:
    *pri_strength = priconv_lvl5[iVar1];
    *sec_strength = 0;
  default:
    return;
  }
  *pri_strength = piVar2[iVar1];
  return;
}

Assistant:

static inline void get_cdef_filter_strengths(CDEF_PICK_METHOD pick_method,
                                             int *pri_strength,
                                             int *sec_strength,
                                             int strength_idx) {
  const int tot_sec_filter =
      (pick_method == CDEF_FAST_SEARCH_LVL5)
          ? REDUCED_SEC_STRENGTHS_LVL5
          : ((pick_method >= CDEF_FAST_SEARCH_LVL3) ? REDUCED_SEC_STRENGTHS_LVL3
                                                    : CDEF_SEC_STRENGTHS);
  const int pri_idx = strength_idx / tot_sec_filter;
  const int sec_idx = strength_idx % tot_sec_filter;
  *pri_strength = pri_idx;
  *sec_strength = sec_idx;
  if (pick_method == CDEF_FULL_SEARCH) return;

  switch (pick_method) {
    case CDEF_FAST_SEARCH_LVL1:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL1);
      *pri_strength = priconv_lvl1[pri_idx];
      break;
    case CDEF_FAST_SEARCH_LVL2:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL2);
      *pri_strength = priconv_lvl2[pri_idx];
      break;
    case CDEF_FAST_SEARCH_LVL3:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL2);
      assert(sec_idx < REDUCED_SEC_STRENGTHS_LVL3);
      *pri_strength = priconv_lvl2[pri_idx];
      *sec_strength = secconv_lvl3[sec_idx];
      break;
    case CDEF_FAST_SEARCH_LVL4:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL4);
      assert(sec_idx < REDUCED_SEC_STRENGTHS_LVL3);
      *pri_strength = priconv_lvl4[pri_idx];
      *sec_strength = secconv_lvl3[sec_idx];
      break;
    case CDEF_FAST_SEARCH_LVL5:
      assert(pri_idx < REDUCED_PRI_STRENGTHS_LVL4);
      assert(sec_idx < REDUCED_SEC_STRENGTHS_LVL5);
      *pri_strength = priconv_lvl5[pri_idx];
      *sec_strength = secconv_lvl5[sec_idx];
      break;
    default: assert(0 && "Invalid CDEF search method");
  }
}